

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

int lookforfunc(lua_State *L,char *path,char *sym)

{
  void *p;
  lua_Integer lVar1;
  lua_CFunction fn;
  char *pcVar2;
  int iVar3;
  
  lua_getfield(L,-0xf4628,"_CLIBS");
  lua_getfield(L,-1,path);
  p = lua_touserdata(L,-1);
  lua_settop(L,-3);
  if (p == (void *)0x0) {
    p = (void *)dlopen(path,(uint)(*sym == '*') << 8 | 2);
    if (p == (void *)0x0) {
      pcVar2 = (char *)dlerror();
      lua_pushstring(L,pcVar2);
      return 1;
    }
    lua_getfield(L,-0xf4628,"_CLIBS");
    lua_pushlightuserdata(L,p);
    lua_pushvalue(L,-1);
    lua_setfield(L,-3,path);
    lVar1 = luaL_len(L,-2);
    lua_rawseti(L,-2,lVar1 + 1);
    lua_settop(L,-2);
  }
  if (*sym == '*') {
    lua_pushboolean(L,1);
    iVar3 = 0;
  }
  else {
    fn = (lua_CFunction)dlsym(p,sym);
    if (fn == (lua_CFunction)0x0) {
      pcVar2 = (char *)dlerror();
      lua_pushstring(L,pcVar2);
      iVar3 = 2;
    }
    else {
      iVar3 = 0;
      lua_pushcclosure(L,fn,0);
    }
  }
  return iVar3;
}

Assistant:

static int lookforfunc (lua_State *L, const char *path, const char *sym) {
  void *reg = checkclib(L, path);  /* check loaded C libraries */
  if (reg == NULL) {  /* must load library? */
    reg = lsys_load(L, path, *sym == '*');  /* global symbols if 'sym'=='*' */
    if (reg == NULL) return ERRLIB;  /* unable to load library */
    addtoclib(L, path, reg);
  }
  if (*sym == '*') {  /* loading only library (no function)? */
    lua_pushboolean(L, 1);  /* return 'true' */
    return 0;  /* no errors */
  }
  else {
    lua_CFunction f = lsys_sym(L, reg, sym);
    if (f == NULL)
      return ERRFUNC;  /* unable to find function */
    lua_pushcfunction(L, f);  /* else create new function */
    return 0;  /* no errors */
  }
}